

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_win_shared_query_
               (MPIABI_Fint *win,MPIABI_Fint *rank,MPIABI_Fint *size,int *disp_unit,void *baseptr,
               MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  void *baseptr_local;
  int *disp_unit_local;
  MPIABI_Fint *size_local;
  MPIABI_Fint *rank_local;
  MPIABI_Fint *win_local;
  
  mpi_win_shared_query_(win,rank,size,disp_unit,baseptr,ierror);
  return;
}

Assistant:

void mpiabi_win_shared_query_(
  const MPIABI_Fint * win,
  const MPIABI_Fint * rank,
  MPIABI_Fint * size,
  int * disp_unit,
  void * baseptr,
  MPIABI_Fint * ierror
) {
  return mpi_win_shared_query_(
    win,
    rank,
    size,
    disp_unit,
    baseptr,
    ierror
  );
}